

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  uint k;
  CTSize CVar1;
  ushort uVar2;
  TraceError e;
  byte bVar3;
  IRRef1 IVar4;
  ushort uVar5;
  IRType IVar6;
  IRType IVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  TRef TVar11;
  ulong uVar12;
  CType *pCVar13;
  GCcdata *pGVar14;
  ushort uVar15;
  uint uVar16;
  IRRef1 IVar17;
  CTState *pCVar18;
  IRRef1 IVar19;
  CType *ct;
  int32_t k_00;
  bool bVar20;
  bool bVar21;
  double *local_48;
  CTSize ofs;
  ulong local_38;
  
  pCVar18 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  uVar16 = sp >> 0x18 & 0x1f;
  if (uVar16 - 0xf < 5) {
    uVar12 = sval->u64;
    uVar16 = 9;
LAB_0012dfe9:
    local_48 = (double *)(ulong)((uVar12 & 0x7fffffffffffffff) != 0);
LAB_0012dfeb:
    ct = (CType *)((long)&pCVar18->tab->info + (ulong)(uVar16 << 4));
  }
  else {
    uVar10 = sp & 0x1f000000;
    if (uVar10 == 0xe000000) {
      uVar12 = sval->u64;
      uVar16 = 0xe;
      goto LAB_0012dfe9;
    }
    if (uVar16 - 1 < 2) {
      sp = lj_ir_kint(J,(uint)(uVar10 == 0x2000000));
      uVar16 = 3;
LAB_0012e6fb:
      local_48 = (double *)0x0;
      goto LAB_0012dfeb;
    }
    uVar16 = 0x11;
    IVar17 = (IRRef1)sp;
    if (uVar10 == 0xc000000) {
      if (*(char *)((ulong)(sval->u32).lo + 6) == '\x01') {
        (J->fold).ins.field_0.op1 = IVar17;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4310000a;
        TVar9 = lj_opt_fold(J);
        TVar11 = lj_ir_kint(J,1);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar17;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4309000b;
        sp = lj_opt_fold(J);
      }
      else {
        TVar9 = lj_ir_kint64(J,0x18);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar17;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
      }
      goto LAB_0012e6fb;
    }
    if (uVar10 == 0x4000000) {
      if ((d->info & 0xf0000000) != 0x50000000) {
        if ((d->info & 0xfc000000) == 0x30000000) {
          e = LJ_TRERR_BADTYPE;
          goto LAB_0012eb39;
        }
        TVar9 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = IVar17;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        sp = lj_opt_fold(J);
        uVar16 = 0x14;
        goto LAB_0012e6fb;
      }
      uVar16 = (sval->u32).lo;
      local_48 = (double *)0x0;
      pCVar13 = lj_ctype_getfieldq(pCVar18,d,&((GCobj *)(ulong)uVar16)->str,&ofs,(CTInfo *)0x0);
      TVar9 = lj_ir_kgc(J,(GCobj *)(ulong)uVar16,IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = IVar17;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      lj_opt_fold(J);
      uVar16 = 0x11;
      if (pCVar13 != (CType *)0x0) {
        if ((pCVar13->info & 0xf0000000) == 0xb0000000) {
          local_48 = (double *)(ulong)(ofs != 0);
          sp = lj_ir_kint(J,ofs);
          uVar16 = (uint)(ushort)pCVar13->info;
        }
        else {
          local_48 = (double *)0x0;
        }
      }
      goto LAB_0012dfeb;
    }
    if (uVar10 == 0) {
      local_48 = (double *)0x0;
      sp = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      goto LAB_0012dfeb;
    }
    pGVar14 = argv2cdata(J,sp,sval);
    pCVar13 = pCVar18->tab;
    uVar16 = pCVar13[pGVar14->ctypeid].info;
    local_38 = (ulong)(uVar16 & 0xffff);
    ct = pCVar13 + pGVar14->ctypeid;
    local_48 = (double *)((ulong)(sval->u32).lo + 8);
    IVar6 = crec_ct2irt(pCVar18,ct);
    uVar16 = uVar16 >> 0x1c;
    uVar2 = (ushort)IVar6;
    if (uVar16 == 2) {
      (J->fold).ins.field_0.ot = uVar2 | 0x4300;
      (J->fold).ins.field_0.op1 = IVar17;
      (J->fold).ins.field_0.op2 = 0xd;
      sp = lj_opt_fold(J);
      if ((ct->info & 0xf0800000) == 0x20800000) {
        local_48 = (double *)*local_48;
        uVar12 = (ulong)((ct->info & 0xffff) << 4);
        uVar16 = *(uint *)((long)&pCVar18->tab->info + uVar12);
        if ((uVar16 & 0xf0000000) == 0x50000000) {
          uVar12 = (ulong)((uVar16 & 0xffff) << 4);
        }
        ct = (CType *)((long)&pCVar18->tab->info + uVar12);
        IVar6 = crec_ct2irt(pCVar18,ct);
LAB_0012eae4:
        if ((ct->info < 0x10000000) && (IVar6 != IRT_CDATA)) {
          (J->fold).ins.field_0.ot = (ushort)IVar6 | 0x4400;
          (J->fold).ins.field_0.op1 = (IRRef1)sp;
          (J->fold).ins.field_0.op2 = 0;
          goto LAB_0012eb18;
        }
      }
    }
    else {
      if (IVar6 - IRT_I64 < 2) {
        (J->fold).ins.field_0.ot = uVar2 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar17;
        (J->fold).ins.field_0.op2 = 0xf;
      }
      else {
        if (1 < IVar6 - IRT_INT) {
          TVar9 = lj_ir_kint64(J,8);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = IVar17;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          sp = lj_opt_fold(J);
          goto LAB_0012eae4;
        }
        if (uVar16 == 5) {
          ct = (CType *)((long)&pCVar13->info + (ulong)(uint)((int)local_38 << 4));
        }
        (J->fold).ins.field_0.ot = uVar2 | 0x4300;
        (J->fold).ins.field_0.op1 = IVar17;
        (J->fold).ins.field_0.op2 = 0xe;
      }
LAB_0012eb18:
      sp = lj_opt_fold(J);
    }
  }
  uVar16 = d->info;
  if ((uVar16 & 0xf0000000) == 0x50000000) {
    uVar12 = (ulong)((uVar16 & 0xffff) << 4);
    d = (CType *)((long)&pCVar18->tab->info + uVar12);
    uVar16 = *(uint *)((long)&pCVar18->tab->info + uVar12);
  }
  pCVar18 = (CTState *)(ulong)J[-1].bpropcache[9].mode;
  IVar6 = crec_ct2irt(pCVar18,d);
  IVar7 = crec_ct2irt(pCVar18,ct);
  if ((0x3fffffff < uVar16) || (uVar10 = ct->info, 0x3fffffff < uVar10))
  goto switchD_0012e0ae_caseD_3;
  k = d->size;
  bVar3 = ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar10 >> 0x18) & 0x3c)) & 0xf) +
          ((byte)(0xf436fff5fff7f021 >> ((byte)(uVar16 >> 0x18) & 0x3c)) & 0xf) * '\b';
  if (0x36 < bVar3) {
    if (bVar3 == 0x3f) goto switchD_0012e0ae_caseD_36;
    goto switchD_0012e0ae_caseD_3;
  }
  uVar16 = ct->size;
  IVar19 = (IRRef1)sp;
  uVar15 = (ushort)IVar7;
  IVar17 = (IRRef1)dp;
  uVar2 = (ushort)IVar6;
  switch(bVar3) {
  case 0:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    break;
  case 1:
  case 2:
    if (IVar7 == IRT_CDATA) goto switchD_0012e0ae_caseD_3;
    if (IVar7 - IRT_FLOAT < 2) {
      TVar9 = lj_ir_knum_u64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else if (IVar7 - IRT_I64 < 2) {
      TVar9 = lj_ir_kint64(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    else {
      TVar9 = lj_ir_kint(J,0);
      IVar4 = (IRRef1)TVar9;
    }
    uVar5 = 0x800;
    k_00 = 0;
    if (local_48 == (double *)0x0) goto LAB_0012e663;
    if (local_48 == (double *)0x1) {
LAB_0012e65a:
      uVar5 = 0x900;
      k_00 = 1;
    }
    else {
      CVar1 = ct->size;
      if ((ct->info & 0x4000000) == 0) {
        if (CVar1 == 4) {
          if (*(float *)local_48 != 0.0) goto LAB_0012e65a;
        }
        else if (CVar1 == 2) {
          if (*(short *)local_48 != 0) goto LAB_0012e65a;
        }
        else if (CVar1 == 1) {
          k_00 = 0;
          if (*(char *)local_48 != '\0') goto LAB_0012e65a;
        }
        else if (*local_48 != 0.0) goto LAB_0012e65a;
      }
      else {
        if (CVar1 == 4) {
          bVar20 = NAN(*(float *)local_48);
          bVar21 = *(float *)local_48 == 0.0;
        }
        else {
          bVar20 = NAN(*local_48);
          bVar21 = *local_48 == 0.0;
        }
        if ((!bVar21) || (bVar20)) goto LAB_0012e65a;
      }
    }
LAB_0012e663:
    (J->fold).ins.field_0.ot = uVar5 | uVar15 | 0x80;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    sp = lj_ir_kint(J,k_00);
    break;
  case 8:
  case 9:
switchD_0012e0ae_caseD_8:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_0012e0ae_caseD_3;
    if ((k == 8) && ((uVar16 < 8 && ((uVar10 & 0x800000) == 0)))) {
      uVar5 = uVar2 | 0x5500;
      if (uVar16 < 4) {
        IVar7 = IRT_INT;
      }
      uVar15 = (ushort)(IVar6 << 5) | (ushort)IVar7 | 0x800;
      goto LAB_0012e4cf;
    }
    if ((7 < k) || (uVar16 != 8)) {
      if (IVar7 == IRT_INT) {
        sp = lj_opt_narrow_toint(J,sp);
      }
      break;
    }
    IVar8 = IRT_INT;
    if (3 < k) {
      IVar8 = IVar6;
    }
    uVar15 = (ushort)IVar7 | (ushort)(IVar8 << 5);
    (J->fold).ins.field_0.ot = (ushort)IVar8 | 0x5500;
    goto LAB_0012e551;
  case 10:
    goto switchD_0012e0ae_caseD_a;
  case 0xb:
    (J->fold).ins.field_0.ot = uVar15 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_0012e0ae_caseD_a:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_0012e0ae_caseD_3;
    IVar7 = IRT_INT;
    if (3 < k) {
      IVar7 = IVar6;
    }
    (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x5500;
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = (ushort)(IVar7 << 5) | uVar15 | 0x1400;
LAB_0012e560:
    sp = lj_opt_fold(J);
    break;
  case 0xd:
  case 0xe:
    if ((k & 8) == 0) {
      IVar7 = IRT_U64;
      uVar10 = 0x800000;
      uVar16 = 8;
      goto switchD_0012e0ae_caseD_8;
    }
    uVar5 = uVar2 | 0x5500;
    uVar15 = (ushort)(IVar6 << 5) | 9;
    goto LAB_0012e4cf;
  case 0x10:
  case 0x11:
    goto switchD_0012e0ae_caseD_10;
  case 0x12:
    goto switchD_0012e0ae_caseD_12;
  case 0x13:
    (J->fold).ins.field_0.ot = uVar15 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    sp = lj_opt_fold(J);
switchD_0012e0ae_caseD_12:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_0012e0ae_caseD_3;
    if (IVar6 == IVar7) break;
    uVar15 = uVar15 | (ushort)(IVar6 << 5);
    (J->fold).ins.field_0.ot = uVar2 | 0x5500;
LAB_0012e551:
    (J->fold).ins.field_0.op1 = (IRRef1)sp;
    (J->fold).ins.field_0.op2 = uVar15;
    goto LAB_0012e560;
  case 0x19:
  case 0x1a:
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar17;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    TVar11 = lj_ir_knum_u64(J,0);
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    lj_opt_fold(J);
    if ((uVar10 >> 0x1a & 1) != 0) goto switchD_0012e0ae_caseD_12;
switchD_0012e0ae_caseD_10:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_0012e0ae_caseD_3;
    uVar5 = uVar2 | 0x5500;
    if (uVar16 < 4) {
      IVar7 = IRT_INT;
    }
    uVar15 = (ushort)(IVar6 << 5) | (ushort)IVar7;
LAB_0012e4cf:
    (J->fold).ins.field_0.ot = uVar5;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = uVar15;
    goto LAB_0012e560;
  case 0x1b:
    if ((IVar6 == IRT_CDATA) || (IVar7 == IRT_CDATA)) goto switchD_0012e0ae_caseD_3;
    (J->fold).ins.field_0.ot = uVar15 | 0x4400;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar9;
    TVar9 = lj_ir_kint64(J,(ulong)(uVar16 >> 1));
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar15 | 0x4400;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar9 = lj_opt_fold(J);
    IVar19 = (IRRef1)TVar9;
    if (IVar6 != IVar7) {
      uVar15 = uVar15 | (ushort)(IVar6 << 5);
      (J->fold).ins.field_0.ot = uVar2 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = uVar15;
      TVar9 = lj_opt_fold(J);
      IVar4 = (IRRef1)TVar9;
      (J->fold).ins.field_0.ot = uVar2 | 0x5500;
      (J->fold).ins.field_0.op1 = IVar19;
      (J->fold).ins.field_0.op2 = uVar15;
      TVar9 = lj_opt_fold(J);
      IVar19 = (IRRef1)TVar9;
    }
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar17;
    (J->fold).ins.field_0.op2 = IVar4;
    lj_opt_fold(J);
    TVar9 = lj_ir_kint64(J,(ulong)(k >> 1));
    (J->fold).ins.field_0.ot = 0x2809;
    (J->fold).ins.field_0.op1 = IVar17;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar19;
    goto LAB_0012e595;
  case 0x29:
    if (IVar7 == IRT_CDATA) goto switchD_0012e0ae_caseD_3;
    break;
  case 0x2a:
    if (IVar7 != IRT_CDATA) {
      uVar5 = k == 8 | 0x5514;
      uVar15 = (ushort)(k == 8) << 5 | uVar15 | 0x1680;
      goto LAB_0012e4cf;
    }
  default:
switchD_0012e0ae_caseD_3:
    e = LJ_TRERR_NYICONV;
LAB_0012eb39:
    lj_trace_err(J,e);
  case 0x36:
switchD_0012e0ae_caseD_36:
    if (dp == 0) goto switchD_0012e0ae_caseD_3;
    TVar9 = lj_ir_kint(J,k);
    crec_copy(J,dp,sp,TVar9,d);
    goto LAB_0012e59a;
  }
  if (dp != 0) {
    (J->fold).ins.field_0.ot = uVar2 | 0x4b00;
    (J->fold).ins.field_0.op1 = IVar17;
    (J->fold).ins.field_0.op2 = (IRRef1)sp;
LAB_0012e595:
    lj_opt_fold(J);
LAB_0012e59a:
    sp = 0;
  }
  return sp;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lua_assert(ctype_child(cts, cct)->size == 4);
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else {  /* NYI: tref_istab(sp), tref_islightud(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    t = crec_ct2irt(cts, s);
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}